

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty-format.c
# Opt level: O0

int rtosc_count_printed_arg_vals_of_msg(char *msg)

{
  ushort **ppuVar1;
  char **in_RDI;
  bool bVar2;
  char *unaff_retaddr;
  undefined7 in_stack_ffffffffffffffe8;
  undefined1 in_stack_ffffffffffffffef;
  int local_4;
  
  skip_while(in_RDI,(_func_int_int *)CONCAT17(in_stack_ffffffffffffffef,in_stack_ffffffffffffffe8));
  while (*(char *)in_RDI == '%') {
    skip_fmt(in_RDI,(char *)CONCAT17(in_stack_ffffffffffffffef,in_stack_ffffffffffffffe8));
  }
  if (*(char *)in_RDI == '/') {
    while( true ) {
      bVar2 = false;
      if (*(char *)in_RDI != '\0') {
        ppuVar1 = __ctype_b_loc();
        bVar2 = ((*ppuVar1)[(int)*(char *)in_RDI] & 0x2000) == 0;
      }
      if (!bVar2) break;
      in_RDI = (char **)((long)in_RDI + 1);
    }
    local_4 = rtosc_count_printed_arg_vals(unaff_retaddr);
  }
  else if (*(char *)in_RDI == '\0') {
    local_4 = -0x80000000;
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int rtosc_count_printed_arg_vals_of_msg(const char* msg)
{
    skip_while(&msg, isspace);
    while (*msg == '%')
        skip_fmt(&msg, "%*[^\n] %n");

    if (*msg == '/') {
        for(; *msg && !isspace(*msg); ++msg);
        return rtosc_count_printed_arg_vals(msg);
    }
    else if(!*msg)
        return INT_MIN;
    else
        return -1;
}